

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O0

char * stumpless_get_element_name(stumpless_element *element)

{
  char *name_copy;
  stumpless_element *element_local;
  
  if (element == (stumpless_element *)0x0) {
    raise_argument_empty("element was NULL");
    element_local = (stumpless_element *)0x0;
  }
  else {
    lock_element(element);
    element_local = (stumpless_element *)alloc_mem(element->name_length + 1);
    if (element_local != (stumpless_element *)0x0) {
      memcpy(element_local,element,element->name_length + 1);
      clear_error();
    }
    unlock_element(element);
  }
  return element_local->name;
}

Assistant:

const char *
stumpless_get_element_name( const struct stumpless_element *element ) {
  char *name_copy;

  VALIDATE_ARG_NOT_NULL( element );

  lock_element( element );
  name_copy = alloc_mem( element->name_length + 1 );
  if( !name_copy ) {
    goto cleanup_and_return;
  }
  memcpy( name_copy, element->name, element->name_length + 1 );
  clear_error(  );

cleanup_and_return:
  unlock_element( element );
  return name_copy;
}